

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void m2d::savanna::load_root_cert(string *cert,context *ctx)

{
  error_code ec_00;
  system_error *this;
  error_code ec;
  const_buffer local_28;
  
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = boost::system::system_category();
  local_28.data_ = (cert->_M_dataplus)._M_p;
  local_28.size_ = cert->_M_string_length;
  boost::asio::ssl::context::add_certificate_authority(ctx,&local_28,&ec);
  if (ec.failed_ != true) {
    boost::asio::ssl::context::set_verify_mode(ctx,1);
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x40);
  ec_00.failed_ = ec.failed_;
  ec_00._5_3_ = ec._5_3_;
  ec_00.val_ = ec.val_;
  ec_00.cat_ = ec.cat_;
  boost::system::system_error::system_error(this,ec_00);
  __cxa_throw(this,&boost::system::system_error::typeinfo,boost::system::system_error::~system_error
             );
}

Assistant:

static void load_root_cert(std::string const &cert, ssl::context &ctx)
	{
		boost::system::error_code ec;
		ctx.add_certificate_authority(boost::asio::buffer(cert.data(), cert.size()), ec);
		if (ec) {
			throw beast::system_error { ec };
		}

		ctx.set_verify_mode(ssl::verify_peer);
	}